

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O2

size_t __thiscall
sai::VirtualFileEntry::Read
          (VirtualFileEntry *this,span<std::byte,_18446744073709551615UL> Destination)

{
  size_t sVar1;
  byte *__s;
  __extent_storage<18446744073709551615UL> _Var2;
  __extent_storage<18446744073709551615UL> _Var3;
  ulong uVar4;
  element_type *peVar5;
  size_t __n;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> ReadBuffer;
  shared_ptr<sai::ifstream> Stream;
  _Head_base<0UL,_std::byte_*,_false> local_1048;
  __shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2> local_1040;
  VirtualPage local_1030;
  
  _Var2 = Destination._M_extent._M_extent_value;
  std::__shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1040);
  peVar5 = local_1040._M_ptr;
  _Var3._M_extent_value = _Var2._M_extent_value;
  if (local_1040._M_ptr != (element_type *)0x0) {
    __s = (byte *)operator_new__(0x1000);
    memset(__s,0,0x1000);
    local_1048._M_head_impl = __s;
    do {
      while( true ) {
        if (peVar5 == (element_type *)0x0) goto LAB_00107479;
        std::istream::seekg((long)peVar5,(int)(this->PageIndex << 0xc) + (int)this->PageOffset);
        uVar4 = this->PageOffset + _Var3._M_extent_value;
        __n = 0x1000 - this->PageOffset;
        sVar1 = 0;
        if (uVar4 < 0x1000) {
          __n = _Var3._M_extent_value;
          sVar1 = uVar4;
        }
        this->PageOffset = sVar1;
        std::istream::read((char *)local_1040._M_ptr,(long)local_1048._M_head_impl);
        memcpy(Destination._M_ptr + (_Var2._M_extent_value - _Var3._M_extent_value),
               local_1048._M_head_impl,__n);
        this->Offset = this->Offset + __n;
        _Var3._M_extent_value = _Var3._M_extent_value - __n;
        if (uVar4 < 0x1000) break;
        GetTablePage(&local_1030,this,this->PageIndex);
        this->PageIndex =
             (ulong)*(uint *)((long)&local_1030 + (ulong)((uint)this->PageIndex & 0x1ff) * 8 + 4);
        peVar5 = local_1040._M_ptr;
      }
      peVar5 = local_1040._M_ptr;
    } while (_Var3._M_extent_value != 0);
    _Var3._M_extent_value = 0;
LAB_00107479:
    std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>::~unique_ptr
              ((unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> *)&local_1048);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1040._M_refcount);
  return _Var2._M_extent_value - _Var3._M_extent_value;
}

Assistant:

std::size_t VirtualFileEntry::Read(std::span<std::byte> Destination)
{
	std::size_t LeftToRead    = Destination.size();
	bool        NeedsNextPage = false;

	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		std::unique_ptr<std::byte[]> ReadBuffer
			= std::make_unique<std::byte[]>(VirtualPage::PageSize);

		while( Stream )
		{
			Stream->seekg(PageIndex * VirtualPage::PageSize + PageOffset, std::ios::beg);

			std::size_t Read;
			if( LeftToRead + PageOffset >= VirtualPage::PageSize )
			{
				Read          = VirtualPage::PageSize - PageOffset;
				PageOffset    = 0;
				NeedsNextPage = true;
			}
			else
			{
				Read = LeftToRead;
				PageOffset += Read;
			}

			Stream->read(reinterpret_cast<char*>(ReadBuffer.get()), Read);
			const std::size_t BytesWritten = Destination.size() - LeftToRead;
			std::memcpy(Destination.data() + BytesWritten, ReadBuffer.get(), Read);

			Offset += Read;
			LeftToRead -= Read;

			if( NeedsNextPage )
			{
				// NOTE: The reason this is here, instead of moving it into the
				// `if (LeftToRead...)` is because `GetTablePage` seeks the
				// stream which mess-ups its position.
				PageIndex = GetTablePage(PageIndex)
								.PageEntries[PageIndex % VirtualPage::TableSpan]
								.NextPageIndex;
				NeedsNextPage = false;
			}
			else if( LeftToRead == 0 )
				break;
		}
	}

	return Destination.size() - LeftToRead;
}